

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void * hd_calloc(hd_context *ctx,size_t count,size_t size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *pvVar3;
  char *fmt;
  
  if (size == 0 || count == 0) {
    return (void *)0x0;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = count;
  if (SUB168(auVar1 * auVar2,8) == 0) {
    pvVar3 = (*ctx->alloc->malloc)(ctx->alloc->user,size * count);
    if (pvVar3 != (void *)0x0) {
      pvVar3 = memset(pvVar3,0,size * count);
      return pvVar3;
    }
    fmt = "calloc (%zu x %zu bytes) failed";
  }
  else {
    fmt = "calloc (%zu x %zu bytes) failed (size_t overflow)";
  }
  hd_throw(ctx,1,fmt,count,size);
}

Assistant:

void *
hd_calloc(hd_context *ctx, size_t count, size_t size)
{
    void *p;

    if (count == 0 || size == 0)
        return 0;

    if (count > SIZE_MAX / size)
    {
        hd_throw(ctx, HD_ERROR_MEMORY, "calloc (" FMT_zu " x " FMT_zu " bytes) failed (size_t overflow)", count, size);
    }

    p = do_scavenging_malloc(ctx, count * size);
    if (!p)
    {
        hd_throw(ctx, HD_ERROR_MEMORY, "calloc (" FMT_zu " x " FMT_zu " bytes) failed", count, size);
    }
    memset(p, 0, count*size);
    return p;
}